

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  void *in_RSI;
  void *in_RDI;
  secp256k1_modinv32_trans2x2 t;
  int count;
  int jac;
  int32_t gn;
  int32_t fn;
  int32_t cond;
  int32_t eta;
  int len;
  int j;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_trans2x2 local_90;
  int local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int32_t local_6c;
  int len_00;
  int in_stack_ffffffffffffff9c;
  secp256k1_modinv32_trans2x2 *in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  secp256k1_modinv32_signed30 local_3c;
  void *local_10;
  
  local_10 = in_RDI;
  memcpy(&local_3c,in_RSI,0x24);
  memcpy(&stack0xffffffffffffffa0,local_10,0x24);
  len_00 = 9;
  local_6c = -1;
  local_7c = 0;
  local_80 = 0;
  do {
    if (0x31 < local_80) {
      return 0;
    }
    local_6c = secp256k1_modinv32_posdivsteps_30_var
                         (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                          (int *)CONCAT44(in_stack_ffffffffffffff9c,len_00));
    secp256k1_modinv32_update_fg_30_var
              (len_00,&local_3c,(secp256k1_modinv32_signed30 *)&stack0xffffffffffffffa0,&local_90);
    if (local_3c.v[0] == 1) {
      local_70 = 0;
      for (in_stack_ffffffffffffff9c = 1; in_stack_ffffffffffffff9c < len_00;
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
        local_70 = local_3c.v[in_stack_ffffffffffffff9c] | local_70;
      }
      if (local_70 == 0) {
        return (local_7c & 1) * -2 + 1;
      }
    }
    local_74 = local_3c.v[len_00 + -1];
    local_78 = *(uint *)(&stack0xffffffffffffffa0 + (long)(len_00 + -1) * 4);
    local_70 = local_78 | local_74 | len_00 + -2 >> 0x1f;
    if (local_70 == 0) {
      len_00 = len_00 + -1;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}